

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestPackage.cpp
# Opt level: O0

void __thiscall vkt::TestCaseExecutor::TestCaseExecutor(TestCaseExecutor *this,TestContext *testCtx)

{
  PtrData<vk::Library,_de::DefaultDeleter<vk::Library>_> data;
  PtrData<vk::DebugReportRecorder,_de::DefaultDeleter<vk::DebugReportRecorder>_> data_00;
  bool bVar1;
  int iVar2;
  Archive *archive;
  Library *pLVar3;
  undefined4 extraout_var;
  CommandLine *this_00;
  MovePtr *this_01;
  InstanceInterface *vki;
  VkInstance instance;
  TestContext *pTVar4;
  DebugReportRecorder *in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  DefaultDeleter<vk::DebugReportRecorder> local_91;
  PtrData<vk::DebugReportRecorder,_de::DefaultDeleter<vk::DebugReportRecorder>_> local_90;
  PtrData<vk::DebugReportRecorder,_de::DefaultDeleter<vk::DebugReportRecorder>_> *local_80;
  PtrData<vk::Library,_de::DefaultDeleter<vk::Library>_> local_70;
  PtrData<vk::Library,_de::DefaultDeleter<vk::Library>_> *local_60;
  allocator<char> local_49;
  string local_48;
  TestContext *local_18;
  TestContext *testCtx_local;
  TestCaseExecutor *this_local;
  undefined4 extraout_var_00;
  
  local_18 = testCtx;
  testCtx_local = (TestContext *)this;
  tcu::TestCaseExecutor::TestCaseExecutor(&this->super_TestCaseExecutor);
  (this->super_TestCaseExecutor)._vptr_TestCaseExecutor =
       (_func_int **)&PTR__TestCaseExecutor_0169bfc0;
  ::vk::ProgramCollection<vk::ProgramBinary>::ProgramCollection(&this->m_progCollection);
  archive = tcu::TestContext::getArchive(local_18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"vulkan/prebuilt",&local_49);
  ::vk::BinaryRegistryDetail::BinaryRegistryReader::BinaryRegistryReader
            (&this->m_prebuiltBinRegistry,archive,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  pTVar4 = local_18;
  createLibrary((MovePtr<vk::Library,_de::DefaultDeleter<vk::Library>_> *)&local_70,local_18);
  local_60 = de::details::MovePtr::operator_cast_to_PtrData(&local_70,(MovePtr *)pTVar4);
  data._8_8_ = in_stack_fffffffffffffee0;
  data.ptr = (Library *)in_stack_fffffffffffffed8;
  de::details::UniquePtr<vk::Library,_de::DefaultDeleter<vk::Library>_>::UniquePtr
            (&this->m_library,data);
  de::details::MovePtr<vk::Library,_de::DefaultDeleter<vk::Library>_>::~MovePtr
            ((MovePtr<vk::Library,_de::DefaultDeleter<vk::Library>_> *)&local_70);
  pTVar4 = local_18;
  pLVar3 = de::details::UniqueBase<vk::Library,_de::DefaultDeleter<vk::Library>_>::operator->
                     (&(this->m_library).
                       super_UniqueBase<vk::Library,_de::DefaultDeleter<vk::Library>_>);
  iVar2 = (*pLVar3->_vptr_Library[2])();
  Context::Context(&this->m_context,pTVar4,(PlatformInterface *)CONCAT44(extraout_var,iVar2),
                   &this->m_progCollection);
  this_00 = tcu::TestContext::getCommandLine(local_18);
  bVar1 = tcu::CommandLine::isValidationEnabled(this_00);
  if (bVar1) {
    pLVar3 = de::details::UniqueBase<vk::Library,_de::DefaultDeleter<vk::Library>_>::operator->
                       (&(this->m_library).
                         super_UniqueBase<vk::Library,_de::DefaultDeleter<vk::Library>_>);
    iVar2 = (*pLVar3->_vptr_Library[2])();
    this_01 = (MovePtr *)CONCAT44(extraout_var_00,iVar2);
    vki = Context::getInstanceInterface(&this->m_context);
    instance = Context::getInstance(&this->m_context);
    anon_unknown_6::createDebugReportRecorder
              ((MovePtr<vk::DebugReportRecorder,_de::DefaultDeleter<vk::DebugReportRecorder>_> *)
               &local_90,(PlatformInterface *)this_01,vki,instance);
  }
  else {
    de::DefaultDeleter<vk::DebugReportRecorder>::DefaultDeleter(&local_91);
    this_01 = (MovePtr *)0x0;
    de::details::MovePtr<vk::DebugReportRecorder,_de::DefaultDeleter<vk::DebugReportRecorder>_>::
    MovePtr((MovePtr<vk::DebugReportRecorder,_de::DefaultDeleter<vk::DebugReportRecorder>_> *)
            &local_90);
  }
  local_80 = de::details::MovePtr::operator_cast_to_PtrData(&local_90,this_01);
  data_00._8_8_ = local_80;
  data_00.ptr = in_stack_fffffffffffffed8;
  de::details::UniquePtr<vk::DebugReportRecorder,_de::DefaultDeleter<vk::DebugReportRecorder>_>::
  UniquePtr(&this->m_debugReportRecorder,data_00);
  de::details::MovePtr<vk::DebugReportRecorder,_de::DefaultDeleter<vk::DebugReportRecorder>_>::
  ~MovePtr((MovePtr<vk::DebugReportRecorder,_de::DefaultDeleter<vk::DebugReportRecorder>_> *)
           &local_90);
  this->m_instance = (TestInstance *)0x0;
  return;
}

Assistant:

TestCaseExecutor::TestCaseExecutor (tcu::TestContext& testCtx)
	: m_prebuiltBinRegistry	(testCtx.getArchive(), "vulkan/prebuilt")
	, m_library				(createLibrary(testCtx))
	, m_context				(testCtx, m_library->getPlatformInterface(), m_progCollection)
	, m_debugReportRecorder	(testCtx.getCommandLine().isValidationEnabled()
							 ? createDebugReportRecorder(m_library->getPlatformInterface(),
														 m_context.getInstanceInterface(),
														 m_context.getInstance())
							 : MovePtr<vk::DebugReportRecorder>(DE_NULL))
	, m_instance			(DE_NULL)
{
}